

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O2

bool myutils::create_cmd_sock_pair(SOCKET *server,SOCKET *client)

{
  int __fd;
  int iVar1;
  SOCKET SVar2;
  char *pcVar3;
  bool bVar4;
  allocator local_69;
  socklen_t addr_len;
  int v;
  undefined1 local_60 [8];
  char local_58 [8];
  string ip;
  
  __fd = socket(2,1,0);
  if (__fd == -1) {
    return false;
  }
  v = 1;
  setsockopt(__fd,1,2,&v,4);
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_60._0_2_ = 2;
  local_60._4_4_ = inet_addr("127.0.0.1");
  local_60._2_2_ = 0;
  iVar1 = bind(__fd,(sockaddr *)local_60,0x10);
  if (iVar1 != 0) {
    close(__fd);
    return false;
  }
  listen(__fd,1);
  addr_len = 0x10;
  getsockname(__fd,(sockaddr *)local_60,&addr_len);
  pcVar3 = inet_ntoa((in_addr)local_60._4_4_);
  std::__cxx11::string::string((string *)&ip,pcVar3,&local_69);
  SVar2 = connect_socket(ip._M_dataplus._M_p,
                         (uint)(ushort)(local_60._2_2_ << 8 | (ushort)local_60._2_2_ >> 8));
  *client = SVar2;
  if (SVar2 != 0) {
    iVar1 = accept(__fd,(sockaddr *)local_60,&addr_len);
    *server = iVar1;
    if (iVar1 != 0) {
      set_socket_nonblock(iVar1,true);
      bVar4 = true;
      close(__fd);
      goto LAB_0014b42e;
    }
    close(__fd);
    __fd = *client;
  }
  close(__fd);
  bVar4 = false;
LAB_0014b42e:
  std::__cxx11::string::~string((string *)&ip);
  return bVar4;
}

Assistant:

bool create_cmd_sock_pair(SOCKET* server, SOCKET* client)
    {
        SOCKET sock = socket(AF_INET, SOCK_STREAM, 0);
        if (sock == INVALID_SOCKET) return false;

        int v = 1;
        setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&v, sizeof(v));

        sockaddr_in addr;
        memset(&addr, 0, sizeof(addr));
        addr.sin_family = AF_INET;
        addr.sin_addr.s_addr = inet_addr("127.0.0.1");
        addr.sin_port = 0;

        if (::bind(sock, (sockaddr*)&addr, sizeof(addr)) != 0) {
            //LOG(FATAL) << "Error binding socket, ec: " << WSAGetLastError();
            closesocket(sock);
            return false;
        }

        listen(sock, 1);
        socklen_t addr_len = sizeof(addr);
        getsockname(sock, (sockaddr*)&addr, &addr_len);
        ////LOG(INFO) << "socks turnel server listen at " << inet_ntoa(addr.sin_addr) << ":" << ntohs(addr.sin_port);

        string ip = inet_ntoa(addr.sin_addr);
        int port = ntohs(addr.sin_port);
        *client = myutils::connect_socket(ip.c_str(), port);
        //CHECK(*client != INVALID_SOCKET);
        if (!*client) {
            closesocket(sock);
            return false;
        }

        *server = accept(sock, (sockaddr*)&addr, &addr_len);
        if (!*server) {
            closesocket(sock);
            closesocket(*client);
            return false;
        }

        myutils::set_socket_nonblock(*server, true);
        closesocket(sock);

        return true;
    }